

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void * cmCreateNewSourceFile(void *param_1)

{
  cmCPluginAPISourceFile *this;
  void *param_0_local;
  
  this = (cmCPluginAPISourceFile *)operator_new(0xb0);
  cmCPluginAPISourceFile::cmCPluginAPISourceFile(this);
  return this;
}

Assistant:

void* CCONV cmCreateNewSourceFile(void*)
{
  return new cmCPluginAPISourceFile;
}